

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase480::run(TestCase480 *this)

{
  bool bVar1;
  char (*extraout_RDX) [4];
  char (*extraout_RDX_00) [4];
  char (*extraout_RDX_01) [4];
  char (*extraout_RDX_02) [4];
  char (*extraout_RDX_03) [4];
  char (*pacVar2) [4];
  char (*extraout_RDX_04) [4];
  bool local_405;
  int local_404;
  bool _kj_shouldLog_15;
  DebugExpression<int_&> DStack_400;
  undefined1 local_3f8 [8];
  DebugComparison<int_&,_int> _kjCondition_15;
  Maybe<int> local_3c8;
  bool local_3bd;
  int local_3bc;
  bool _kj_shouldLog_14;
  DebugExpression<int_&> DStack_3b8;
  undefined1 local_3b0 [8];
  DebugComparison<int_&,_int> _kjCondition_14;
  Maybe<int> local_380;
  anon_class_8_1_ba1d8281 local_378;
  anon_class_8_1_ba1d8281 func_5;
  int val_1;
  bool _kj_shouldLog_13;
  DebugExpression<bool_&> _kjCondition_13;
  int local_358;
  bool _kj_shouldLog_12;
  Maybe<kj::String> local_350;
  int local_330;
  DebugExpression<int> local_32c;
  undefined1 local_328 [8];
  DebugComparison<int,_int> _kjCondition_12;
  bool _kj_shouldLog_11;
  DebugExpression<bool> _kjCondition_11;
  bool _kj_shouldLog_10;
  Maybe<kj::String> local_2e8;
  int local_2c8;
  DebugExpression<int> local_2c4;
  undefined1 local_2c0 [8];
  DebugComparison<int,_int> _kjCondition_10;
  anon_class_8_1_c65f9af0 func_4;
  bool wasNull_1;
  DebugExpression<bool_&> DStack_290;
  bool _kj_shouldLog_9;
  DebugExpression<bool_&> _kjCondition_9;
  int local_280;
  bool _kj_shouldLog_8;
  Maybe<int> local_278;
  int local_270;
  DebugExpression<int> local_26c;
  undefined1 local_268 [8];
  DebugComparison<int,_int> _kjCondition_8;
  int local_240;
  bool _kj_shouldLog_7;
  DebugExpression<bool> _kjCondition_7;
  bool _kj_shouldLog_6;
  Maybe<int> local_238;
  int local_230;
  DebugExpression<int> local_22c;
  undefined1 local_228 [8];
  DebugComparison<int,_int> _kjCondition_6;
  anon_class_8_1_c65f9af0 func_3;
  bool wasNull;
  bool _kj_shouldLog_5;
  DebugExpression<int_&> DStack_1f8;
  undefined1 local_1f0 [8];
  DebugComparison<int_&,_int> _kjCondition_5;
  Maybe<int> local_1c0;
  bool local_1b5;
  int local_1b4;
  bool _kj_shouldLog_4;
  DebugExpression<int_&> DStack_1b0;
  undefined1 local_1a8 [8];
  DebugComparison<int_&,_int> _kjCondition_4;
  Maybe<int> local_178;
  anon_class_8_1_ba1d8281 local_170;
  anon_class_8_1_ba1d8281 func_2;
  int val;
  bool _kj_shouldLog_3;
  Maybe<kj::String> local_158;
  int local_138;
  DebugExpression<int> local_134;
  undefined1 local_130 [8];
  DebugComparison<int,_int> _kjCondition_3;
  undefined1 local_108 [3];
  bool _kj_shouldLog_2;
  Maybe<kj::String> local_f0;
  int local_d0;
  DebugExpression<int> local_cc;
  undefined1 local_c8 [8];
  DebugComparison<int,_int> _kjCondition_2;
  int local_a0;
  anon_class_1_0_00000001 func_1;
  bool _kj_shouldLog_1;
  Maybe<int> local_98;
  int local_90;
  DebugExpression<int> local_8c;
  undefined1 local_88 [8];
  DebugComparison<int,_int> _kjCondition_1;
  int local_60;
  bool _kj_shouldLog;
  int local_4c;
  Maybe<int> local_48;
  int local_40;
  DebugExpression<int> local_3c;
  undefined1 local_38 [8];
  DebugComparison<int,_int> _kjCondition;
  anon_class_1_0_00000001 func;
  TestCase480 *this_local;
  
  _kjCondition._31_1_ = 0;
  local_4c = 0x7b;
  Maybe<int>::Maybe(&local_48,&local_4c);
  local_40 = run::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)&_kjCondition.field_0x1f,&local_48);
  local_3c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_40);
  local_60 = 0x7d;
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_38,&local_3c,&local_60)
  ;
  Maybe<int>::~Maybe(&local_48);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    _kjCondition_1._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1e8,ERROR,"\"failed: expected \" \"func(123) == 125\", _kjCondition",
                 (char (*) [34])"failed: expected func(123) == 125",
                 (DebugComparison<int,_int> *)local_38);
      _kjCondition_1._31_1_ = 0;
    }
  }
  Maybe<int>::Maybe();
  local_90 = run::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)&_kjCondition.field_0x1f,&local_98);
  local_8c = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
  local_a0 = -1;
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_88,&local_8c,&local_a0)
  ;
  Maybe<int>::~Maybe(&local_98);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  pacVar2 = extraout_RDX;
  if (!bVar1) {
    _kjCondition_2._31_1_ = kj::_::Debug::shouldLog(ERROR);
    pacVar2 = extraout_RDX_00;
    while (_kjCondition_2._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1e9,ERROR,"\"failed: expected \" \"func(kj::none) == -1\", _kjCondition",
                 (char (*) [38])"failed: expected func(kj::none) == -1",
                 (DebugComparison<int,_int> *)local_88);
      pacVar2 = extraout_RDX_01;
      _kjCondition_2._31_1_ = 0;
    }
  }
  str<char_const(&)[4]>((String *)local_108,(kj *)0x315fe3,pacVar2);
  Maybe<kj::String>::Maybe(&local_f0,(String *)local_108);
  local_d0 = run::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)&_kjCondition_2.field_0x1e,&local_f0);
  local_cc = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d0);
  _kjCondition_3._28_4_ = 0x7b;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_c8,&local_cc,(int *)&_kjCondition_3.field_0x1c);
  Maybe<kj::String>::~Maybe(&local_f0);
  String::~String((String *)local_108);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c8);
  if (!bVar1) {
    _kjCondition_3._27_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._27_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1f2,ERROR,
                 "\"failed: expected \" \"func(kj::str(\\\"123\\\")) == 123\", _kjCondition",
                 (char (*) [45])"failed: expected func(kj::str(\"123\")) == 123",
                 (DebugComparison<int,_int> *)local_c8);
      _kjCondition_3._27_1_ = 0;
    }
  }
  Maybe<kj::String>::Maybe();
  local_138 = run::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&_kjCondition_2.field_0x1e,&local_158);
  local_134 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_138);
  val = -1;
  kj::_::DebugExpression<int>::operator==((DebugComparison<int,_int> *)local_130,&local_134,&val);
  Maybe<kj::String>::~Maybe(&local_158);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_130);
  if (!bVar1) {
    func_2.val._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)func_2.val._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,499,ERROR,"\"failed: expected \" \"func(kj::none) == -1\", _kjCondition",
                 (char (*) [38])"failed: expected func(kj::none) == -1",
                 (DebugComparison<int,_int> *)local_130);
      func_2.val._7_1_ = false;
    }
  }
  func_2.val._0_4_ = 0;
  local_170.val = (int *)&func_2;
  _kjCondition_4._36_4_ = 0x7b;
  Maybe<int>::Maybe(&local_178,(int *)&_kjCondition_4.field_0x24);
  run::anon_class_8_1_ba1d8281::operator()(&local_170,&local_178);
  Maybe<int>::~Maybe(&local_178);
  DStack_1b0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)&func_2);
  local_1b4 = 0x7b;
  kj::_::DebugExpression<int&>::operator==
            ((DebugComparison<int_&,_int> *)local_1a8,
             (DebugExpression<int&> *)&stack0xfffffffffffffe50,&local_1b4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a8);
  if (!bVar1) {
    local_1b5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b5 != false) {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1fe,ERROR,"\"failed: expected \" \"val == 123\", _kjCondition",
                 (char (*) [28])"failed: expected val == 123",
                 (DebugComparison<int_&,_int> *)local_1a8);
      local_1b5 = false;
    }
  }
  func_2.val._0_4_ = 0x141;
  Maybe<int>::Maybe();
  run::anon_class_8_1_ba1d8281::operator()(&local_170,&local_1c0);
  Maybe<int>::~Maybe(&local_1c0);
  DStack_1f8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)&func_2);
  func_3.wasNull._4_4_ = 0x141;
  kj::_::DebugExpression<int&>::operator==
            ((DebugComparison<int_&,_int> *)local_1f0,
             (DebugExpression<int&> *)&stack0xfffffffffffffe08,(int *)((long)&func_3.wasNull + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f0);
  if (!bVar1) {
    func_3.wasNull._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)func_3.wasNull._3_1_ != false) {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x201,ERROR,"\"failed: expected \" \"val == 321\", _kjCondition",
                 (char (*) [28])"failed: expected val == 321",
                 (DebugComparison<int_&,_int> *)local_1f0);
      func_3.wasNull._3_1_ = false;
    }
  }
  func_3.wasNull._2_1_ = 0;
  _kjCondition_6._24_8_ = (long)&func_3.wasNull + 2;
  __kj_shouldLog_7 = 0x7b;
  Maybe<int>::Maybe(&local_238,(int *)&_kj_shouldLog_7);
  local_230 = run::anon_class_8_1_c65f9af0::operator()
                        ((anon_class_8_1_c65f9af0 *)&_kjCondition_6.result,&local_238);
  local_22c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_230);
  local_240 = 0x7d;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_228,&local_22c,&local_240);
  Maybe<int>::~Maybe(&local_238);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_228);
  if (!bVar1) {
    _kjCondition_8._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x210,ERROR,"\"failed: expected \" \"func(123) == 125\", _kjCondition",
                 (char (*) [34])"failed: expected func(123) == 125",
                 (DebugComparison<int,_int> *)local_228);
      _kjCondition_8._31_1_ = 0;
    }
  }
  _kjCondition_8._29_1_ = (func_3.wasNull._2_1_ ^ 0xff) & 1;
  _kjCondition_8._30_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_8.field_0x1d);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_8.field_0x1e);
  if (!bVar1) {
    _kjCondition_8._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._28_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x211,ERROR,"\"failed: expected \" \"!wasNull\", _kjCondition",
                 (char (*) [26])"failed: expected !wasNull",
                 (DebugExpression<bool> *)&_kjCondition_8.field_0x1e);
      _kjCondition_8._28_1_ = 0;
    }
  }
  Maybe<int>::Maybe();
  local_270 = run::anon_class_8_1_c65f9af0::operator()
                        ((anon_class_8_1_c65f9af0 *)&_kjCondition_6.result,&local_278);
  local_26c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_270);
  local_280 = -1;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_268,&local_26c,&local_280);
  Maybe<int>::~Maybe(&local_278);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_268);
  if (!bVar1) {
    _kjCondition_9.value._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_kjCondition_9.value._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x212,ERROR,"\"failed: expected \" \"func(kj::none) == -1\", _kjCondition",
                 (char (*) [38])"failed: expected func(kj::none) == -1",
                 (DebugComparison<int,_int> *)local_268);
      _kjCondition_9.value._7_1_ = false;
    }
  }
  DStack_290 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&func_3.wasNull + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xfffffffffffffd70)
  ;
  pacVar2 = extraout_RDX_02;
  if (!bVar1) {
    func_4.wasNull._7_1_ = kj::_::Debug::shouldLog(ERROR);
    pacVar2 = extraout_RDX_03;
    while ((bool)func_4.wasNull._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[25],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x213,ERROR,"\"failed: expected \" \"wasNull\", _kjCondition",
                 (char (*) [25])"failed: expected wasNull",&stack0xfffffffffffffd70);
      pacVar2 = extraout_RDX_04;
      func_4.wasNull._7_1_ = false;
    }
  }
  func_4.wasNull._6_1_ = 0;
  _kjCondition_10._24_8_ = (long)&func_4.wasNull + 6;
  str<char_const(&)[4]>((String *)&_kj_shouldLog_11,(kj *)0x315fe3,pacVar2);
  Maybe<kj::String>::Maybe(&local_2e8,(String *)&_kj_shouldLog_11);
  local_2c8 = run::anon_class_8_1_c65f9af0::operator()
                        ((anon_class_8_1_c65f9af0 *)&_kjCondition_10.result,&local_2e8);
  local_2c4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2c8);
  _kjCondition_12._28_4_ = 0x7b;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_2c0,&local_2c4,(int *)&_kjCondition_12.field_0x1c);
  Maybe<kj::String>::~Maybe(&local_2e8);
  String::~String((String *)&_kj_shouldLog_11);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2c0);
  if (!bVar1) {
    _kjCondition_12._27_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_12._27_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x220,ERROR,
                 "\"failed: expected \" \"func(kj::str(\\\"123\\\")) == 123\", _kjCondition",
                 (char (*) [45])"failed: expected func(kj::str(\"123\")) == 123",
                 (DebugComparison<int,_int> *)local_2c0);
      _kjCondition_12._27_1_ = 0;
    }
  }
  _kjCondition_12._25_1_ = (func_4.wasNull._6_1_ ^ 0xff) & 1;
  _kjCondition_12._26_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_12.field_0x19);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_12.field_0x1a);
  if (!bVar1) {
    _kjCondition_12.result = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_12.result != false) {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x221,ERROR,"\"failed: expected \" \"!wasNull\", _kjCondition",
                 (char (*) [26])"failed: expected !wasNull",
                 (DebugExpression<bool> *)&_kjCondition_12.field_0x1a);
      _kjCondition_12.result = false;
    }
  }
  Maybe<kj::String>::Maybe();
  local_330 = run::anon_class_8_1_c65f9af0::operator()
                        ((anon_class_8_1_c65f9af0 *)&_kjCondition_10.result,&local_350);
  local_32c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_330);
  local_358 = -1;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_328,&local_32c,&local_358);
  Maybe<kj::String>::~Maybe(&local_350);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_328);
  if (!bVar1) {
    _kjCondition_13.value._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_kjCondition_13.value._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x222,ERROR,"\"failed: expected \" \"func(kj::none) == -1\", _kjCondition",
                 (char (*) [38])"failed: expected func(kj::none) == -1",
                 (DebugComparison<int,_int> *)local_328);
      _kjCondition_13.value._7_1_ = false;
    }
  }
  _val_1 = kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (bool *)((long)&func_4.wasNull + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&val_1);
  if (!bVar1) {
    func_5.val._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)func_5.val._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[25],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x223,ERROR,"\"failed: expected \" \"wasNull\", _kjCondition",
                 (char (*) [25])"failed: expected wasNull",(DebugExpression<bool_&> *)&val_1);
      func_5.val._7_1_ = false;
    }
  }
  func_5.val._0_4_ = 0;
  local_378.val = (int *)&func_5;
  _kjCondition_14._36_4_ = 0x7b;
  Maybe<int>::Maybe(&local_380,(int *)&_kjCondition_14.field_0x24);
  run::anon_class_8_1_ba1d8281::operator()(&local_378,&local_380);
  Maybe<int>::~Maybe(&local_380);
  DStack_3b8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)&func_5);
  local_3bc = 0x7b;
  kj::_::DebugExpression<int&>::operator==
            ((DebugComparison<int_&,_int> *)local_3b0,
             (DebugExpression<int&> *)&stack0xfffffffffffffc48,&local_3bc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3b0);
  if (!bVar1) {
    local_3bd = kj::_::Debug::shouldLog(ERROR);
    while (local_3bd != false) {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x230,ERROR,"\"failed: expected \" \"val == 123\", _kjCondition",
                 (char (*) [28])"failed: expected val == 123",
                 (DebugComparison<int_&,_int> *)local_3b0);
      local_3bd = false;
    }
  }
  func_5.val._0_4_ = 0x141;
  Maybe<int>::Maybe();
  run::anon_class_8_1_ba1d8281::operator()(&local_378,&local_3c8);
  Maybe<int>::~Maybe(&local_3c8);
  DStack_400 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)&func_5);
  local_404 = 0x141;
  kj::_::DebugExpression<int&>::operator==
            ((DebugComparison<int_&,_int> *)local_3f8,
             (DebugExpression<int&> *)&stack0xfffffffffffffc00,&local_404);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3f8);
  if (!bVar1) {
    local_405 = kj::_::Debug::shouldLog(ERROR);
    while (local_405 != false) {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x233,ERROR,"\"failed: expected \" \"val == 321\", _kjCondition",
                 (char (*) [28])"failed: expected val == 321",
                 (DebugComparison<int_&,_int> *)local_3f8);
      local_405 = false;
    }
  }
  return;
}

Assistant:

TEST(Common, MaybeUnwrapOrReturn) {
  {
    auto func = [](Maybe<int> i) -> int {
      int& j = KJ_UNWRAP_OR_RETURN(i, -1);
      KJ_EXPECT(&j == &KJ_ASSERT_NONNULL(i));
      return j + 2;
    };

    KJ_EXPECT(func(123) == 125);
    KJ_EXPECT(func(kj::none) == -1);
  }

  {
    auto func = [&](Maybe<String> maybe) -> int {
      String str = KJ_UNWRAP_OR_RETURN(kj::mv(maybe), -1);
      return str.parseAs<int>();
    };

    KJ_EXPECT(func(kj::str("123")) == 123);
    KJ_EXPECT(func(kj::none) == -1);
  }

  // Test void return.
  {
    int val = 0;
    auto func = [&](Maybe<int> i) {
      val = KJ_UNWRAP_OR_RETURN(i);
    };

    func(123);
    KJ_EXPECT(val == 123);
    val = 321;
    func(kj::none);
    KJ_EXPECT(val == 321);
  }

  // Test KJ_UNWRAP_OR
  {
    bool wasNull = false;
    auto func = [&](Maybe<int> i) -> int {
      int& j = KJ_UNWRAP_OR(i, {
        wasNull = true;
        return -1;
      });
      KJ_EXPECT(&j == &KJ_ASSERT_NONNULL(i));
      return j + 2;
    };

    KJ_EXPECT(func(123) == 125);
    KJ_EXPECT(!wasNull);
    KJ_EXPECT(func(kj::none) == -1);
    KJ_EXPECT(wasNull);
  }

  {
    bool wasNull = false;
    auto func = [&](Maybe<String> maybe) -> int {
      String str = KJ_UNWRAP_OR(kj::mv(maybe), {
        wasNull = true;
        return -1;
      });
      return str.parseAs<int>();
    };

    KJ_EXPECT(func(kj::str("123")) == 123);
    KJ_EXPECT(!wasNull);
    KJ_EXPECT(func(kj::none) == -1);
    KJ_EXPECT(wasNull);
  }

  // Test void return.
  {
    int val = 0;
    auto func = [&](Maybe<int> i) {
      val = KJ_UNWRAP_OR(i, {
        return;
      });
    };

    func(123);
    KJ_EXPECT(val == 123);
    val = 321;
    func(kj::none);
    KJ_EXPECT(val == 321);
  }

}